

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::checkType(UniValue *this,VType *expected)

{
  type_error *this_00;
  char *pcVar1;
  long in_FS_OFFSET;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == *expected) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (type_error *)__cxa_allocate_exception(0x10);
    pcVar1 = uvTypeName(this->typ);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar1,&local_c9);
    std::operator+(&local_88,"JSON value of type ",&local_a8);
    std::operator+(&local_68,&local_88," is not of expected type ");
    pcVar1 = uvTypeName(*expected);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_ca);
    std::operator+(&local_48,&local_68,&local_c8);
    type_error::runtime_error(this_00,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::checkType(const VType& expected) const
{
    if (typ != expected) {
        throw type_error{"JSON value of type " + std::string{uvTypeName(typ)} + " is not of expected type " +
                                 std::string{uvTypeName(expected)}};
    }
}